

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

ShaderResourceVariableDesc
Diligent::FindPipelineResourceLayoutVariable
          (PipelineResourceLayoutDesc *LayoutDesc,char *Name,SHADER_TYPE ShaderStage,
          char *CombinedSamplerSuffix)

{
  ShaderResourceVariableDesc SVar1;
  bool bVar2;
  SHADER_TYPE SVar3;
  ShaderResourceVariableDesc *pSVar4;
  Char *Message;
  undefined1 local_78 [8];
  string msg;
  ShaderResourceVariableDesc *Var2;
  Uint32 j;
  ShaderResourceVariableDesc *Var;
  Uint32 i;
  char *CombinedSamplerSuffix_local;
  SHADER_TYPE ShaderStage_local;
  char *Name_local;
  PipelineResourceLayoutDesc *LayoutDesc_local;
  undefined8 local_10;
  
  for (Var._4_4_ = 0; Var._4_4_ < LayoutDesc->NumVariables; Var._4_4_ = Var._4_4_ + 1) {
    pSVar4 = LayoutDesc->Variables + Var._4_4_;
    SVar3 = operator&(pSVar4->ShaderStages,ShaderStage);
    if ((SVar3 != SHADER_TYPE_UNKNOWN) &&
       (bVar2 = StreqSuff(Name,pSVar4->Name,CombinedSamplerSuffix,false), bVar2)) goto LAB_00c0cce7;
  }
  SVar3 = operator&(ShaderStage,LayoutDesc->DefaultVariableMergeStages);
  CombinedSamplerSuffix_local._4_4_ = ShaderStage;
  if (SVar3 != SHADER_TYPE_UNKNOWN) {
    CombinedSamplerSuffix_local._4_4_ = LayoutDesc->DefaultVariableMergeStages;
  }
  ShaderResourceVariableDesc::ShaderResourceVariableDesc
            ((ShaderResourceVariableDesc *)&LayoutDesc_local,CombinedSamplerSuffix_local._4_4_,Name,
             LayoutDesc->DefaultVariableType,SHADER_VARIABLE_FLAG_NONE);
LAB_00c0ce17:
  SVar1.ShaderStages = (SHADER_TYPE)local_10;
  SVar1.Type = local_10._4_1_;
  SVar1.Flags = local_10._5_1_;
  SVar1._14_2_ = local_10._6_2_;
  SVar1.Name = (Char *)LayoutDesc_local;
  return SVar1;
LAB_00c0cce7:
  while (Var2._4_4_ = Var._4_4_ + 1, Var2._4_4_ < LayoutDesc->NumVariables) {
    msg.field_2._8_8_ = LayoutDesc->Variables + Var2._4_4_;
    SVar3 = operator&(((ShaderResourceVariableDesc *)msg.field_2._8_8_)->ShaderStages,ShaderStage);
    Var._4_4_ = Var2._4_4_;
    if ((SVar3 != SHADER_TYPE_UNKNOWN) &&
       (bVar2 = StreqSuff(Name,*(char **)msg.field_2._8_8_,CombinedSamplerSuffix,false), bVar2)) {
      FormatString<char[149]>
                ((string *)local_78,
                 (char (*) [149])
                 "There must be no variables with overlapping stages in Desc.ResourceLayout. This error should\'ve been caught by ValidatePipelineResourceLayoutDesc()."
                );
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"FindPipelineResourceLayoutVariable",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x39c);
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  LayoutDesc_local = (PipelineResourceLayoutDesc *)pSVar4->Name;
  local_10._0_4_ = pSVar4->ShaderStages;
  local_10._4_1_ = pSVar4->Type;
  local_10._5_1_ = pSVar4->Flags;
  local_10._6_2_ = *(undefined2 *)&pSVar4->field_0xe;
  goto LAB_00c0ce17;
}

Assistant:

ShaderResourceVariableDesc FindPipelineResourceLayoutVariable(
    const PipelineResourceLayoutDesc& LayoutDesc,
    const char*                       Name,
    SHADER_TYPE                       ShaderStage,
    const char*                       CombinedSamplerSuffix)
{
    for (Uint32 i = 0; i < LayoutDesc.NumVariables; ++i)
    {
        const ShaderResourceVariableDesc& Var = LayoutDesc.Variables[i];
        if ((Var.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var.Name, CombinedSamplerSuffix))
        {
#ifdef DILIGENT_DEBUG
            for (Uint32 j = i + 1; j < LayoutDesc.NumVariables; ++j)
            {
                const ShaderResourceVariableDesc& Var2 = LayoutDesc.Variables[j];
                VERIFY(!((Var2.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var2.Name, CombinedSamplerSuffix)),
                       "There must be no variables with overlapping stages in Desc.ResourceLayout. "
                       "This error should've been caught by ValidatePipelineResourceLayoutDesc().");
            }
#endif
            return Var;
        }
    }

    // Use default properties
    if (ShaderStage & LayoutDesc.DefaultVariableMergeStages)
        ShaderStage = LayoutDesc.DefaultVariableMergeStages;
    return {ShaderStage, Name, LayoutDesc.DefaultVariableType};
}